

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void remove_always_return_values_from_list(ListNode *map_head)

{
  ListNode *pLVar1;
  ListNode *in_RDI;
  ListNode *next;
  ListNode *current;
  ListNode *cleanup_value;
  ListNode *node;
  
  _assert_true((unsigned_long)next,(char *)in_RDI,(char *)0x0,0);
  pLVar1 = in_RDI->next->next;
  node = in_RDI->next;
  while (cleanup_value = pLVar1, node != in_RDI) {
    if (node->refcount < -1) {
      list_remove_free(node,(CleanupListValue)cleanup_value,(void *)0x174e4e);
    }
    pLVar1 = cleanup_value->next;
    node = cleanup_value;
  }
  return;
}

Assistant:

static void remove_always_return_values_from_list(ListNode * const map_head)
{
    ListNode * current = NULL;
    ListNode * next = NULL;
    assert_non_null(map_head);

    for (current = map_head->next, next = current->next;
            current != map_head;
            current = next, next = current->next) {
        if (current->refcount < -1) {
            list_remove_free(current, free_value, NULL);
        }
    }
}